

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
LiteTest_MapCrash_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~LiteTest_MapCrash_Test
          (LiteTest_MapCrash_Test<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST(LiteTest, MapCrash) {
  // See b/113635730
  Arena arena;
  auto msg = Arena::Create<proto2_unittest::TestMapLite>(&arena);
  // Payload for the map<string, Enum> with a enum varint that's longer >
  // 10 bytes. This causes a parse fail and a subsequent delete. field 16
  // (map<int32, MapEnumLite>) tag = 128+2 = \202 \1
  //   13 long \15
  //   int32 key = 1  (\10 \1)
  //   MapEnumLite value = too long varint (parse error)
  EXPECT_FALSE(msg->ParseFromString(
      "\202\1\15\10\1\200\200\200\200\200\200\200\200\200\200\1"));
}